

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu.cpp
# Opt level: O0

int ncnn::cpu_support_x86_avx_ne_convert(void)

{
  try_initialize_global_cpu_info();
  return g_cpu_support_x86_avx_ne_convert;
}

Assistant:

int cpu_support_x86_avx_ne_convert()
{
    try_initialize_global_cpu_info();
#if defined(__i386__) || defined(__x86_64__) || defined(_M_IX86) || defined(_M_X64)
    return g_cpu_support_x86_avx_ne_convert;
#else
    return 0;
#endif
}